

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

int __thiscall QProcess::close(QProcess *this,int __fd)

{
  QIODevicePrivate *this_00;
  int iVar1;
  
  this_00 = (QIODevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  QIODevice::aboutToClose(&this->super_QIODevice);
  do {
    iVar1 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0x18])(this,0xffffffff);
  } while ((char)iVar1 != '\0');
  QProcessPrivate::killProcess((QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d);
  waitForFinished(this,-1);
  iVar1 = 0;
  QIODevicePrivate::setWriteChannelCount(this_00,0);
  iVar1 = QIODevice::close(&this->super_QIODevice,iVar1);
  return iVar1;
}

Assistant:

void QProcess::close()
{
    Q_D(QProcess);
    emit aboutToClose();
    while (waitForBytesWritten(-1))
        ;
    kill();
    waitForFinished(-1);
    d->setWriteChannelCount(0);
    QIODevice::close();
}